

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_dertransportcoeff
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
               Real param_7,int *param_8,int param_9)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  GpuArray<double,_324U> *pGVar11;
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *pTVar12;
  int i;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  int i_13;
  long lVar26;
  long lVar27;
  double *pdVar28;
  int j;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int i_14;
  double *pdVar38;
  int iVar39;
  long lVar40;
  double *pdVar41;
  bool bVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  long local_378;
  long local_370;
  long local_350;
  long local_348;
  double local_330;
  double local_328;
  Real Xloc [9];
  double local_1f8 [8];
  undefined1 *local_1b8;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  Real muloc [9];
  Real y [9];
  Real lamloc [9];
  double local_78 [9];
  
  pTVar12 = PeleLM::trans_parms.m_d_trans_parm;
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar23 = (long)iVar3;
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar32 = (long)iVar4;
  lVar13 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar35 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar3) + 1);
  lVar36 = lVar35 * lVar13;
  lVar14 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
  lVar37 = lVar36 * lVar14;
  iVar3 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar40 = (long)iVar4;
  lVar24 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  lVar29 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
  lVar30 = lVar29 * lVar24;
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar15 = (long)iVar4;
  lVar21 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
  lVar31 = lVar30 * lVar21;
  lVar34 = (dcomp + 9) * lVar31;
  lVar26 = (dcomp + 10) * lVar31;
  pdVar8 = (datfab->super_BaseFab<double>).dptr;
  pdVar9 = (derfab->super_BaseFab<double>).dptr;
  if (PeleLM::unity_Le == 0) {
    iVar4 = (bx->smallend).vect[0];
    iVar5 = (bx->bigend).vect[0];
    local_198 = (long)(bx->smallend).vect[1];
    local_188 = (long)(bx->smallend).vect[2];
    iVar6 = (bx->bigend).vect[1];
    local_190 = (long)(bx->bigend).vect[2];
    lVar35 = (long)pdVar8 +
             ((lVar14 * 0x10 + local_188 * 8 + lVar32 * -8) * lVar35 + local_198 * 8 + lVar23 * -8)
             * lVar13 + (long)iVar2 * -8;
    local_1a0 = lVar36 * 8;
    pGVar11 = &(PeleLM::trans_parms.m_d_trans_parm)->fitdbin;
    lVar14 = (long)pdVar9 +
             ((local_188 * 8 + dcomp * lVar21 * 8 + lVar15 * -8) * lVar29 + local_198 * 8 +
             lVar40 * -8) * lVar24 + (long)iVar3 * -8;
    local_1a8 = lVar30 * 8;
    for (; local_188 <= local_190; local_188 = local_188 + 1) {
      local_170 = pdVar8 + lVar37 + (local_188 - lVar32) * lVar36;
      lVar21 = (local_188 - lVar15) * lVar30;
      local_178 = pdVar9 + lVar34 + lVar21;
      local_180 = pdVar9 + lVar26 + lVar21;
      local_350 = lVar35;
      local_348 = lVar14;
      for (lVar21 = local_198; pdVar25 = local_170, pdVar19 = local_178, pdVar38 = local_180,
          lVar21 <= iVar6; lVar21 = lVar21 + 1) {
        if (iVar4 <= iVar5) {
          lVar29 = (lVar21 - lVar40) * lVar24;
          iVar7 = iVar4;
          do {
            pdVar41 = (double *)(local_348 + (long)iVar7 * 8);
            pdVar20 = (double *)(local_350 + (long)iVar7 * 8);
            local_1f8[0] = 0.49603174603174605;
            local_1f8[1] = 0.03125195324707794;
            local_1f8[2] = 0.055509297807382736;
            local_1f8[3] = 0.9920634920634921;
            local_1f8[4] = 0.06250390649415588;
            local_1f8[5] = 0.05879931792791203;
            local_1f8[6] = 0.030297521662727988;
            local_1f8[7] = 0.029399658963956014;
            local_1b8 = &DAT_3fa246cdaf410bdd;
            dVar47 = 0.0;
            lVar27 = 9;
            pdVar28 = pdVar20;
            while (bVar42 = lVar27 != 0, lVar27 = lVar27 + -1, bVar42) {
              dVar47 = dVar47 + *pdVar28;
              pdVar28 = pdVar28 + lVar37;
            }
            y[6] = 0.0;
            y[7] = 0.0;
            y[4] = 0.0;
            y[5] = 0.0;
            y[2] = 0.0;
            y[3] = 0.0;
            y[0] = 0.0;
            y[1] = 0.0;
            y[8] = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              y[lVar27] = *pdVar20 * (1.0 / dVar47);
              pdVar20 = pdVar20 + lVar37;
            }
            dVar47 = pdVar25[(lVar21 - lVar23) * lVar13 + (long)(iVar7 - iVar2)];
            Xloc[0] = 0.49603174603174605;
            Xloc[1] = 0.03125195324707794;
            Xloc[2] = 0.055509297807382736;
            Xloc[3] = 0.9920634920634921;
            Xloc[4] = 0.06250390649415588;
            Xloc[5] = 0.05879931792791203;
            Xloc[6] = 0.030297521662727988;
            Xloc[7] = 0.029399658963956014;
            Xloc[8] = (Real)&DAT_3fa246cdaf410bdd;
            local_328 = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              local_328 = local_328 + y[lVar27] * Xloc[lVar27];
            }
            local_78[6] = 0.0;
            local_78[7] = 0.0;
            local_78[4] = 0.0;
            local_78[5] = 0.0;
            local_78[8] = 0.0;
            local_78[2] = 0.0;
            local_78[3] = 0.0;
            local_78[0] = 0.0;
            local_78[1] = 0.0;
            Xloc[6] = 0.0;
            Xloc[7] = 0.0;
            Xloc[4] = 0.0;
            Xloc[5] = 0.0;
            Xloc[2] = 0.0;
            Xloc[3] = 0.0;
            Xloc[8] = 0.0;
            Xloc[0] = 0.0;
            Xloc[1] = 0.0;
            muloc[6] = 0.0;
            muloc[7] = 0.0;
            muloc[4] = 0.0;
            muloc[5] = 0.0;
            muloc[2] = 0.0;
            muloc[3] = 0.0;
            muloc[0] = 0.0;
            muloc[1] = 0.0;
            muloc[8] = 0.0;
            dVar43 = log(dVar47);
            dVar44 = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              dVar44 = dVar44 + y[lVar27];
            }
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              y[lVar27] = (dVar44 / 9.0 - y[lVar27]) * 1e-15 + y[lVar27];
            }
            dVar44 = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              dVar44 = dVar44 + y[lVar27] * (pTVar12->iwt).arr[lVar27];
            }
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              Xloc[lVar27] = y[lVar27] * (1.0 / dVar44) * (pTVar12->iwt).arr[lVar27];
            }
            dVar46 = dVar43 * dVar43;
            dVar44 = dVar43 * dVar46;
            for (lVar27 = 0; lVar27 != 0x48; lVar27 = lVar27 + 8) {
              dVar45 = exp(*(double *)((long)(pTVar12->fitmu).arr + lVar27 * 4 + 0x18) * dVar44 +
                           *(double *)((long)(pTVar12->fitmu).arr + lVar27 * 4 + 0x10) * dVar46 +
                           *(double *)((long)(pTVar12->fitmu).arr + lVar27 * 4 + 8) * dVar43 +
                           *(double *)((long)(pTVar12->fitmu).arr + lVar27 * 4));
              *(double *)((long)muloc + lVar27) = dVar45;
            }
            dVar45 = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              dVar48 = muloc[lVar27];
              dVar45 = dVar45 + dVar48 * dVar48 * dVar48 * dVar48 * dVar48 * dVar48 * Xloc[lVar27];
            }
            if (dVar45 < 0.0) {
              dVar45 = sqrt(dVar45);
            }
            else {
              dVar45 = SQRT(dVar45);
            }
            lamloc[6] = 0.0;
            lamloc[7] = 0.0;
            lamloc[4] = 0.0;
            lamloc[5] = 0.0;
            lamloc[2] = 0.0;
            lamloc[3] = 0.0;
            lamloc[0] = 0.0;
            lamloc[1] = 0.0;
            lamloc[8] = 0.0;
            for (lVar27 = 0; lVar27 != 0x48; lVar27 = lVar27 + 8) {
              dVar48 = exp(*(double *)((long)(pTVar12->fitlam).arr + lVar27 * 4 + 0x18) * dVar44 +
                           *(double *)((long)(pTVar12->fitlam).arr + lVar27 * 4 + 0x10) * dVar46 +
                           *(double *)((long)(pTVar12->fitlam).arr + lVar27 * 4 + 8) * dVar43 +
                           *(double *)((long)(pTVar12->fitlam).arr + lVar27 * 4));
              *(double *)((long)lamloc + lVar27) = dVar48;
            }
            local_330 = 0.0;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              dVar48 = Xloc[lVar27];
              dVar49 = lamloc[lVar27];
              if (dVar49 < 0.0) {
                dVar49 = sqrt(dVar49);
              }
              else {
                dVar49 = SQRT(dVar49);
              }
              if (dVar49 < 0.0) {
                dVar49 = sqrt(dVar49);
              }
              else {
                dVar49 = SQRT(dVar49);
              }
              local_330 = local_330 + dVar48 * dVar49;
            }
            pdVar20 = pGVar11->arr + 3;
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              dVar49 = 0.0;
              dVar48 = 0.0;
              pdVar28 = pdVar20;
              for (lVar33 = 0; lVar33 != 9; lVar33 = lVar33 + 1) {
                if (lVar27 != lVar33) {
                  dVar49 = dVar49 + y[lVar33];
                  dVar1 = Xloc[lVar33];
                  dVar10 = exp(-(*pdVar28 * dVar44 +
                                pdVar28[-1] * dVar46 +
                                pdVar28[-2] * dVar43 +
                                ((GpuArray<double,_324U> *)(pdVar28 + -3))->arr[0]));
                  dVar48 = dVar48 + dVar10 * dVar1;
                }
                pdVar28 = pdVar28 + 0x24;
              }
              local_78[lVar27] =
                   ((dVar49 * (pTVar12->wt).arr[lVar27]) / dVar48) *
                   (1013250.0 / (dVar47 * 83144626.1815324));
              pdVar20 = pdVar20 + 4;
            }
            for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
              *pdVar41 = local_78[lVar27] * (1.0 / local_328) * local_1f8[lVar27] * 0.1;
              pdVar41 = pdVar41 + lVar31;
            }
            dVar47 = cbrt(dVar45);
            pdVar19[lVar29 + (iVar7 - iVar3)] =
                 local_330 * local_330 * local_330 * local_330 * 1e-05;
            pdVar38[lVar29 + (iVar7 - iVar3)] = dVar47 * 0.1;
            bVar42 = iVar7 != iVar5;
            iVar7 = iVar7 + 1;
          } while (bVar42);
        }
        local_350 = local_350 + lVar13 * 8;
        local_348 = local_348 + lVar24 * 8;
      }
      lVar35 = lVar35 + local_1a0;
      lVar14 = lVar14 + local_1a8;
    }
  }
  else {
    dVar43 = 1.0 / PeleLM::schmidt;
    dVar47 = 1.0 / PeleLM::prandtl;
    iVar4 = (bx->smallend).vect[0];
    iVar5 = (bx->bigend).vect[0];
    lVar27 = (long)(bx->smallend).vect[2];
    lVar33 = (long)(bx->smallend).vect[1];
    iVar6 = (bx->bigend).vect[1];
    iVar7 = (bx->bigend).vect[2];
    lVar35 = (long)pdVar8 +
             ((lVar14 * 0x10 + lVar27 * 8 + lVar32 * -8) * lVar35 + lVar33 * 8 + lVar23 * -8) *
             lVar13 + (long)iVar2 * -8;
    lVar14 = (long)pdVar9 +
             ((lVar27 * 8 + dcomp * lVar21 * 8 + lVar15 * -8) * lVar29 + lVar33 * 8 + lVar40 * -8) *
             lVar24 + (long)iVar3 * -8;
    for (; lVar27 <= iVar7; lVar27 = lVar27 + 1) {
      lVar29 = (lVar27 - lVar32) * lVar36;
      lVar16 = (lVar27 - lVar15) * lVar30;
      local_378 = lVar14;
      local_370 = lVar35;
      for (lVar21 = lVar33; lVar21 <= iVar6; lVar21 = lVar21 + 1) {
        if (iVar4 <= iVar5) {
          lVar17 = (lVar21 - lVar23) * lVar13;
          lVar18 = (lVar21 - lVar40) * lVar24;
          iVar39 = iVar4;
          do {
            pdVar38 = (double *)(local_378 + (long)iVar39 * 8);
            pdVar19 = (double *)(local_370 + (long)iVar39 * 8);
            dVar44 = 0.0;
            lVar22 = 9;
            pdVar25 = pdVar19;
            while (bVar42 = lVar22 != 0, lVar22 = lVar22 + -1, bVar42) {
              dVar44 = dVar44 + *pdVar25;
              pdVar25 = pdVar25 + lVar37;
            }
            local_1f8[6] = 0.0;
            local_1f8[7] = 0.0;
            local_1f8[4] = 0.0;
            local_1f8[5] = 0.0;
            local_1f8[2] = 0.0;
            local_1f8[3] = 0.0;
            local_1f8[0] = 0.0;
            local_1f8[1] = 0.0;
            local_1b8 = (undefined1 *)0x0;
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              local_1f8[lVar22] = *pdVar19 * (1.0 / dVar44);
              pdVar19 = pdVar19 + lVar37;
            }
            Xloc[6] = 0.0;
            Xloc[7] = 0.0;
            Xloc[4] = 0.0;
            Xloc[5] = 0.0;
            Xloc[2] = 0.0;
            Xloc[3] = 0.0;
            Xloc[8] = 0.0;
            Xloc[0] = 0.0;
            Xloc[1] = 0.0;
            muloc[6] = 0.0;
            muloc[7] = 0.0;
            muloc[4] = 0.0;
            muloc[5] = 0.0;
            muloc[2] = 0.0;
            muloc[3] = 0.0;
            muloc[0] = 0.0;
            muloc[1] = 0.0;
            muloc[8] = 0.0;
            dVar44 = log(pdVar8[lVar37 + lVar29 + lVar17 + (iVar39 - iVar2)]);
            dVar46 = 0.0;
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              dVar46 = dVar46 + local_1f8[lVar22];
            }
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              local_1f8[lVar22] = (dVar46 / 9.0 - local_1f8[lVar22]) * 1e-15 + local_1f8[lVar22];
            }
            dVar46 = 0.0;
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              dVar46 = dVar46 + local_1f8[lVar22] * (pTVar12->iwt).arr[lVar22];
            }
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              Xloc[lVar22] = local_1f8[lVar22] * (1.0 / dVar46) * (pTVar12->iwt).arr[lVar22];
            }
            for (lVar22 = 0; lVar22 != 0x48; lVar22 = lVar22 + 8) {
              dVar46 = exp(*(double *)((long)(pTVar12->fitmu).arr + lVar22 * 4 + 0x18) *
                           dVar44 * dVar44 * dVar44 +
                           *(double *)((long)(pTVar12->fitmu).arr + lVar22 * 4 + 0x10) *
                           dVar44 * dVar44 +
                           *(double *)((long)(pTVar12->fitmu).arr + lVar22 * 4 + 8) * dVar44 +
                           *(double *)((long)(pTVar12->fitmu).arr + lVar22 * 4));
              *(double *)((long)muloc + lVar22) = dVar46;
            }
            dVar44 = 0.0;
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              dVar46 = muloc[lVar22];
              dVar44 = dVar44 + dVar46 * dVar46 * dVar46 * dVar46 * dVar46 * dVar46 * Xloc[lVar22];
            }
            if (dVar44 < 0.0) {
              dVar44 = sqrt(dVar44);
            }
            else {
              dVar44 = SQRT(dVar44);
            }
            dVar44 = cbrt(dVar44);
            dVar44 = dVar44 * 0.1;
            pdVar9[lVar26 + lVar16 + lVar18 + (iVar39 - iVar3)] = dVar44;
            lVar22 = 9;
            while (bVar42 = lVar22 != 0, lVar22 = lVar22 + -1, bVar42) {
              *pdVar38 = dVar43 * dVar44;
              pdVar38 = pdVar38 + lVar31;
            }
            dVar46 = pdVar8[lVar37 + lVar29 + lVar17 + (iVar39 - iVar2)];
            dVar49 = dVar46 * dVar46;
            dVar48 = dVar46 * dVar49;
            dVar45 = dVar46 * dVar48;
            lamloc[0] = 0.49603174603174605;
            lamloc[1] = 0.03125195324707794;
            lamloc[2] = 0.055509297807382736;
            lamloc[3] = 0.9920634920634921;
            lamloc[4] = 0.06250390649415588;
            lamloc[5] = 0.05879931792791203;
            lamloc[6] = 0.030297521662727988;
            lamloc[7] = 0.029399658963956014;
            lamloc[8] = (Real)&DAT_3fa246cdaf410bdd;
            if (1000.0 <= dVar46) {
              Xloc[0] = dVar45 * 1.58275179e-15 +
                        dVar48 * -9.23157818e-12 +
                        dVar49 * -5.63382869e-08 + dVar46 * 0.000700064411 + 2.99142337;
              Xloc[1] = dVar45 * -1.13643531e-15 +
                        dVar48 * 1.77528148e-11 +
                        dVar49 * -1.25884199e-07 + dVar46 * 0.000613519689 + 3.69757819;
              Xloc[4] = dVar45 * -4.3680515e-16 +
                        dVar48 * 4.55106742e-12 +
                        dVar49 * -3.10280335e-09 + dVar46 * -2.75506191e-05 + 2.54205966;
              Xloc[5] = dVar45 * -1.33195876e-15 +
                        dVar48 * 3.05218674e-11 +
                        dVar49 * -2.59082758e-07 + dVar46 * 0.00105650448 + 2.86472886;
              Xloc[6] = dVar45 * -1.07908535e-14 +
                        dVar48 * 1.1424637e-10 +
                        dVar49 * -6.3365815e-07 + dVar46 * 0.00223982013 + 4.0172109;
              Xloc[7] = dVar45 * -1.43165356e-14 +
                        dVar48 * 2.34890357e-10 +
                        dVar49 * -1.47468882e-06 + dVar46 * 0.00433613639 + 4.57316685;
              dVar50 = dVar48 * 1.20099639e-10 +
                       dVar49 * -8.73026011e-07 + dVar46 * 0.00305629289 + 2.67214561;
              dVar51 = dVar48 * 1.009704e-10 +
                       dVar49 * -5.684761e-07 + dVar46 * 0.001487977 + 2.92664;
              dVar1 = -6.39161787e-15;
              dVar10 = -6.753351e-15;
            }
            else {
              Xloc[0] = dVar45 * 4.13487224e-13 +
                        dVar48 * -9.47543433e-11 +
                        dVar49 * -8.14301529e-07 + dVar46 * 0.000824944174 + 3.29812431;
              Xloc[1] = dVar45 * -8.76855392e-13 +
                        dVar48 * 1.31387723e-09 +
                        dVar49 * -5.75615047e-07 + dVar46 * 0.00112748635 + 3.2129364;
              Xloc[4] = dVar45 * 3.89069636e-13 +
                        dVar48 * -1.60284319e-09 +
                        dVar49 * 2.4210317e-06 + dVar46 * -0.00163816649 + 2.94642878;
              Xloc[5] = dVar45 * 2.06237379e-12 +
                        dVar48 * -5.79853643e-09 +
                        dVar49 * 6.52764691e-06 + dVar46 * -0.00322544939 + 4.12530561;
              Xloc[6] = dVar45 * 9.29225124e-12 +
                        dVar48 * -2.42763894e-08 +
                        dVar49 * 2.11582891e-05 + dVar46 * -0.00474912051 + 4.30179801;
              Xloc[7] = dVar45 * 2.47151475e-12 +
                        dVar48 * -4.62580552e-09 +
                        dVar49 * -1.48501258e-07 + dVar46 * 0.00656922581 + 3.38875365;
              dVar50 = dVar48 * 6.96858127e-09 +
                       dVar49 * -6.35469633e-06 + dVar46 * 0.00347498246 + 3.38684249;
              dVar51 = dVar48 * 5.641515e-09 +
                       dVar49 * -3.963222e-06 + dVar46 * 0.00140824 + 3.298677;
              dVar1 = -2.50658847e-12;
              dVar10 = -2.444855e-12;
            }
            Xloc[2] = dVar45 * dVar1 + dVar50;
            Xloc[3] = dVar45 * 0.0 + dVar48 * 0.0 + dVar49 * 0.0 + dVar46 * 0.0 + 2.5;
            Xloc[8] = dVar45 * dVar10 + dVar51;
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              muloc[lVar22] = Xloc[lVar22] * local_1f8[lVar22] * lamloc[lVar22];
            }
            dVar46 = 0.0;
            for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
              dVar46 = dVar46 + muloc[lVar22];
            }
            pdVar9[lVar34 + lVar16 + lVar18 + (iVar39 - iVar3)] =
                 dVar46 * 83144626.1815324 * 0.0001 * dVar44 * dVar47;
            bVar42 = iVar39 != iVar5;
            iVar39 = iVar39 + 1;
          } while (bVar42);
        }
        local_370 = local_370 + lVar13 * 8;
        local_378 = local_378 + lVar24 * 8;
      }
      lVar35 = lVar35 + lVar36 * 8;
      lVar14 = lVar14 + lVar30 * 8;
    }
  }
  return;
}

Assistant:

void pelelm_dertransportcoeff (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+2);
    AMREX_ASSERT(ncomp == NUM_SPECIES+2);
    auto const T       = datfab.array(1);
    auto const rhoY    = datfab.array(2);
    auto       rhoD    = derfab.array(dcomp);
    auto       lambda  = derfab.array(dcomp+NUM_SPECIES);
    auto       mu      = derfab.array(dcomp+NUM_SPECIES+1);

    // Get the transport GPU data pointer
    auto const* ltransparm = PeleLM::trans_parms.device_trans_parm();
    if ( PeleLM::unity_Le ) {
      amrex::Real ScInv = 1.0/PeleLM::schmidt;
      amrex::Real PrInv = 1.0/PeleLM::prandtl;
      amrex::ParallelFor(bx,
			 [T, rhoY, rhoD, lambda, mu, ScInv, PrInv, ltransparm] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
	getTransportCoeffUnityLe( i, j, k, ScInv, PrInv, rhoY, T, rhoD, lambda, mu, ltransparm);
      });
    } else {
      amrex::ParallelFor(bx,
      [T, rhoY, rhoD, lambda, mu, ltransparm] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          getTransportCoeff( i, j, k, rhoY, T, rhoD, lambda, mu, ltransparm);
      });
    }

}